

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_PlaneEquation::MaximumValueAt(ON_PlaneEquation *this,ON_BoundingBox *bbox)

{
  double dVar1;
  double s;
  double zz;
  double yy;
  double xx;
  ON_BoundingBox *bbox_local;
  ON_PlaneEquation *this_local;
  
  dVar1 = this->x * (bbox->m_min).x;
  yy = this->x * (bbox->m_max).x;
  if (yy < dVar1) {
    yy = dVar1;
  }
  dVar1 = this->y * (bbox->m_min).y;
  zz = this->y * (bbox->m_max).y;
  if (zz < dVar1) {
    zz = dVar1;
  }
  dVar1 = this->z * (bbox->m_min).z;
  s = this->z * (bbox->m_max).z;
  if (s < dVar1) {
    s = dVar1;
  }
  return yy + zz + s + this->d;
}

Assistant:

double ON_PlaneEquation::MaximumValueAt(const ON_BoundingBox& bbox) const
{
  double xx, yy, zz, s;

  s = x*bbox.m_min.x;
  if ( s > (xx = x*bbox.m_max.x) ) xx = s;

  s = y*bbox.m_min.y;
  if ( s > (yy = y*bbox.m_max.y) ) yy = s;

  s = z*bbox.m_min.z;
  if ( s > (zz = z*bbox.m_max.z) ) zz = s;

  return (xx + yy + zz + d);
}